

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  Enum EVar2;
  ctrl_t *pcVar3;
  ulong uVar4;
  slot_type *psVar5;
  size_t __n;
  pointer __s2;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i match;
  char cVar29;
  char cVar33;
  char cVar34;
  char cVar35;
  
  pcVar3 = this->ctrl_;
  if (pcVar3 != (ctrl_t *)0x0) {
    uVar4 = this->capacity_;
    if ((uVar4 + 1 & uVar4) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar28 = hashval >> 7;
    auVar30 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar30 = pshuflw(auVar30,auVar30,0);
    psVar5 = this->slots_;
    EVar2 = elem->first;
    __n = (elem->second)._M_string_length;
    __s2 = (elem->second)._M_dataplus._M_p;
    uVar27 = 0;
    while( true ) {
      uVar28 = uVar28 & uVar4;
      pcVar1 = pcVar3 + uVar28;
      cVar8 = *pcVar1;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      cVar29 = auVar30[0];
      auVar31[0] = -(cVar29 == cVar8);
      cVar33 = auVar30[1];
      auVar31[1] = -(cVar33 == cVar9);
      cVar34 = auVar30[2];
      auVar31[2] = -(cVar34 == cVar10);
      cVar35 = auVar30[3];
      auVar31[3] = -(cVar35 == cVar11);
      auVar31[4] = -(cVar29 == cVar12);
      auVar31[5] = -(cVar33 == cVar13);
      auVar31[6] = -(cVar34 == cVar14);
      auVar31[7] = -(cVar35 == cVar15);
      auVar31[8] = -(cVar29 == cVar16);
      auVar31[9] = -(cVar33 == cVar17);
      auVar31[10] = -(cVar34 == cVar18);
      auVar31[0xb] = -(cVar35 == cVar19);
      auVar31[0xc] = -(cVar29 == cVar20);
      auVar31[0xd] = -(cVar33 == cVar21);
      auVar31[0xe] = -(cVar34 == cVar22);
      auVar31[0xf] = -(cVar35 == cVar23);
      uVar7 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
      if (uVar7 != 0) {
        uVar25 = (uint)uVar7;
        do {
          uVar6 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar26 = uVar6 + uVar28 & uVar4;
          if ((psVar5[uVar26].value.first == EVar2) &&
             ((&psVar5->value)[uVar26].second._M_string_length == __n)) {
            if (__n == 0) {
              return true;
            }
            iVar24 = bcmp((&psVar5->value)[uVar26].second._M_dataplus._M_p,__s2,__n);
            if (iVar24 == 0) {
              return true;
            }
          }
          uVar25 = uVar25 - 1 & uVar25;
        } while (uVar25 != 0);
      }
      auVar32[0] = -(cVar8 == -0x80);
      auVar32[1] = -(cVar9 == -0x80);
      auVar32[2] = -(cVar10 == -0x80);
      auVar32[3] = -(cVar11 == -0x80);
      auVar32[4] = -(cVar12 == -0x80);
      auVar32[5] = -(cVar13 == -0x80);
      auVar32[6] = -(cVar14 == -0x80);
      auVar32[7] = -(cVar15 == -0x80);
      auVar32[8] = -(cVar16 == -0x80);
      auVar32[9] = -(cVar17 == -0x80);
      auVar32[10] = -(cVar18 == -0x80);
      auVar32[0xb] = -(cVar19 == -0x80);
      auVar32[0xc] = -(cVar20 == -0x80);
      auVar32[0xd] = -(cVar21 == -0x80);
      auVar32[0xe] = -(cVar22 == -0x80);
      auVar32[0xf] = -(cVar23 == -0x80);
      if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar23 == -0x80)
      break;
      uVar28 = uVar28 + uVar27 + 0x10;
      uVar27 = uVar27 + 0x10;
      if (uVar4 <= uVar27) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
                     );
      }
    }
  }
  return false;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }